

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathCompVariableReference(xmlXPathParserContextPtr ctxt)

{
  int iVar1;
  bool bVar2;
  xmlChar *local_20;
  xmlChar *prefix;
  xmlChar *name;
  xmlXPathParserContextPtr ctxt_local;
  
  while( true ) {
    bVar2 = true;
    if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar2 = true, 10 < *ctxt->cur)))) {
      bVar2 = *ctxt->cur == '\r';
    }
    if (!bVar2) break;
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
  }
  name = (xmlChar *)ctxt;
  if (*ctxt->cur == '$') {
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
    prefix = xmlXPathParseQName(ctxt,&local_20);
    if (prefix == (xmlChar *)0x0) {
      (*xmlFree)(local_20);
      xmlXPathErr((xmlXPathParserContextPtr)name,4);
    }
    else {
      *(undefined4 *)(*(long *)(name + 0x38) + 0x10) = 0xffffffff;
      iVar1 = xmlXPathCompExprAdd((xmlXPathParserContextPtr)name,
                                  *(int *)(*(long *)(name + 0x38) + 0x10),-1,XPATH_OP_VARIABLE,0,0,0
                                  ,prefix,local_20);
      if (iVar1 == -1) {
        (*xmlFree)(local_20);
        (*xmlFree)(prefix);
      }
      while( true ) {
        bVar2 = true;
        if ((**(char **)name != ' ') &&
           ((**(byte **)name < 9 || (bVar2 = true, 10 < **(byte **)name)))) {
          bVar2 = **(char **)name == '\r';
        }
        if (!bVar2) break;
        if (**(char **)name != '\0') {
          *(long *)name = *(long *)name + 1;
        }
      }
      if ((*(long *)(name + 0x18) != 0) && ((*(uint *)(*(long *)(name + 0x18) + 0x150) & 2) != 0)) {
        xmlXPathErr((xmlXPathParserContextPtr)name,0x18);
      }
    }
  }
  else {
    xmlXPathErr(ctxt,4);
  }
  return;
}

Assistant:

static void
xmlXPathCompVariableReference(xmlXPathParserContextPtr ctxt) {
    xmlChar *name;
    xmlChar *prefix;

    SKIP_BLANKS;
    if (CUR != '$') {
	XP_ERROR(XPATH_VARIABLE_REF_ERROR);
    }
    NEXT;
    name = xmlXPathParseQName(ctxt, &prefix);
    if (name == NULL) {
        xmlFree(prefix);
	XP_ERROR(XPATH_VARIABLE_REF_ERROR);
    }
    ctxt->comp->last = -1;
    if (PUSH_LONG_EXPR(XPATH_OP_VARIABLE, 0, 0, 0, name, prefix) == -1) {
        xmlFree(prefix);
        xmlFree(name);
    }
    SKIP_BLANKS;
    if ((ctxt->context != NULL) && (ctxt->context->flags & XML_XPATH_NOVAR)) {
	XP_ERROR(XPATH_FORBID_VARIABLE_ERROR);
    }
}